

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O0

void Js::CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
               (JavascriptString *s,CharCount startIndex,CharCount appendCharLength,
               Builder<256U> *toString,bool appendChars)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  uint *puVar6;
  char16_t *pcVar7;
  JavascriptLibrary *this;
  CharStringCache *this_00;
  char16 *pcVar8;
  char16_t *pcVar9;
  char16_t *local_68;
  void *local_50;
  void *packedSubstringInfo2;
  void *packedSubstringInfo;
  JavascriptString *js;
  char16 *appendBuffer;
  uint local_28;
  char16 c;
  Builder<256U> *pBStack_20;
  bool appendChars_local;
  Builder<256U> *toString_local;
  CharCount appendCharLength_local;
  CharCount startIndex_local;
  JavascriptString *s_local;
  
  c._1_1_ = appendChars;
  pBStack_20 = toString;
  toString_local._0_4_ = appendCharLength;
  toString_local._4_4_ = startIndex;
  _appendCharLength_local = s;
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x429,"(s)","s");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar1 = toString_local._4_4_;
  cVar4 = JavascriptString::GetLength(_appendCharLength_local);
  if (cVar4 < uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42a,"(startIndex <= s->GetLength())",
                                "startIndex <= s->GetLength()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar1 = (CharCount)toString_local;
  cVar4 = JavascriptString::GetLength(_appendCharLength_local);
  if (cVar4 - toString_local._4_4_ < uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42b,"(appendCharLength <= s->GetLength() - startIndex)",
                                "appendCharLength <= s->GetLength() - startIndex");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pBStack_20 == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42c,"(toString)","toString");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = Builder<256U>::IsFinalized(pBStack_20);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42d,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = Builder<256U>::OwnsLastBlock(pBStack_20);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42e,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((c._1_1_ & 1) != 0) && (bVar3 = Builder<256U>::HasOnlyDirectChars(pBStack_20), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42f,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((CharCount)toString_local == 0) {
    return;
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
  if (bVar3) {
    local_28 = 8;
    puVar6 = min<unsigned_int>(&local_28,(uint *)&toString_local);
    uVar1 = *puVar6;
    bVar3 = JavascriptString::IsFinalized(_appendCharLength_local);
    if (bVar3) {
      pcVar8 = JavascriptString::GetString(_appendCharLength_local);
      local_68 = pcVar8 + toString_local._4_4_;
    }
    else {
      local_68 = L"";
    }
    bVar3 = JavascriptString::IsFinalized(_appendCharLength_local);
    pcVar9 = L"";
    if (!bVar3 || 8 < (CharCount)toString_local) {
      pcVar9 = L"...";
    }
    pcVar7 = L"false";
    if ((c._1_1_ & 1) != 0) {
      pcVar7 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(JavascriptString *s = \"%.*s%s\", startIndex = %u, appendCharLength = %u, appendChars = %s)\n"
                  ,(ulong)uVar1,local_68,pcVar9,(ulong)toString_local._4_4_,
                  (ulong)(CharCount)toString_local,pcVar7);
    Output::Flush();
  }
  if (((c._1_1_ & 1) != 0) || (bVar3 = Builder<256U>::HasOnlyDirectChars(pBStack_20), bVar3)) {
    if ((CharCount)toString_local == 1) {
      pcVar8 = Builder<256U>::GetAppendStringBuffer(pBStack_20,_appendCharLength_local);
      appendBuffer._6_2_ = pcVar8[toString_local._4_4_];
      bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(appendBuffer._6_2_,pBStack_20);
      if (bVar3) {
        return;
      }
      Builder<256U>::AppendSlow(pBStack_20,appendBuffer._6_2_);
      return;
    }
    if (((c._1_1_ & 1) != 0) ||
       (bVar3 = Block::ShouldAppendChars((CharCount)toString_local,8), bVar3)) {
      pcVar8 = Builder<256U>::GetAppendStringBuffer(pBStack_20,_appendCharLength_local);
      js = (JavascriptString *)(pcVar8 + toString_local._4_4_);
      if ((c._1_1_ & 1) == 0) {
        bVar3 = TryAppendFewCharsGeneric<Js::CompoundString::Builder<256u>>
                          ((char16 *)js,(CharCount)toString_local,pBStack_20);
        if (bVar3) {
          return;
        }
      }
      else {
        bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>
                          ((char16 *)js,(CharCount)toString_local,pBStack_20);
        if (bVar3) {
          return;
        }
      }
      Builder<256U>::AppendSlow(pBStack_20,(char16 *)js,(CharCount)toString_local);
      return;
    }
    Builder<256U>::SwitchToPointerMode(pBStack_20);
  }
  if ((CharCount)toString_local == 1) {
    this = Builder<256U>::GetLibrary(pBStack_20);
    this_00 = JavascriptLibrary::GetCharStringCache(this);
    pcVar8 = Builder<256U>::GetAppendStringBuffer(pBStack_20,_appendCharLength_local);
    packedSubstringInfo = CharStringCache::GetStringForChar(this_00,pcVar8[toString_local._4_4_]);
    bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>
                      ((JavascriptString *)packedSubstringInfo,1,pBStack_20);
    if (!bVar3) {
      Builder<256U>::AppendSlow(pBStack_20,(JavascriptString *)packedSubstringInfo);
    }
  }
  else {
    PackSubstringInfo(toString_local._4_4_,(CharCount)toString_local,&packedSubstringInfo2,&local_50
                     );
    bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>
                      (_appendCharLength_local,packedSubstringInfo2,local_50,
                       (CharCount)toString_local,pBStack_20);
    if (!bVar3) {
      Builder<256U>::AppendSlow
                (pBStack_20,_appendCharLength_local,packedSubstringInfo2,local_50,
                 (CharCount)toString_local);
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        JavascriptString *const s,
        const CharCount startIndex,
        const CharCount appendCharLength,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(startIndex <= s->GetLength());
        Assert(appendCharLength <= s->GetLength() - startIndex);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(JavascriptString *s = \"%.*s%s\", startIndex = %u, appendCharLength = %u, appendChars = %s)\n"),
                min(static_cast<CharCount>(8), appendCharLength),
                s->IsFinalized() ? &s->GetString()[startIndex] : _u(""),
                !s->IsFinalized() || appendCharLength > 8 ? _u("...") : _u(""),
                startIndex,
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = toString->GetAppendStringBuffer(s)[startIndex];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            if(appendChars || Block::ShouldAppendChars(appendCharLength, sizeof(void *)))
            {
                const char16 *const appendBuffer = &toString->GetAppendStringBuffer(s)[startIndex];
                if(appendChars
                        ? TryAppendGeneric(appendBuffer, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(appendBuffer, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(appendBuffer, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        if(appendCharLength == 1)
        {
            JavascriptString *const js =
                toString->GetLibrary()->GetCharStringCache().GetStringForChar(toString->GetAppendStringBuffer(s)[startIndex]);
            if(TryAppendGeneric(js, 1, toString))
                return;
            toString->AppendSlow(js);
            return;
        }

        void *packedSubstringInfo, *packedSubstringInfo2;
        PackSubstringInfo(startIndex, appendCharLength, &packedSubstringInfo, &packedSubstringInfo2);
        if(TryAppendGeneric(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength, toString))
            return;
        toString->AppendSlow(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength);
    }